

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDefs.cpp
# Opt level: O0

void glu::checkError(deUint32 err,char *msg,char *file,int line)

{
  ostream *poVar1;
  OutOfMemoryError *this;
  char *pcVar2;
  Error *this_00;
  Enum<int,_2UL> EVar3;
  Enum<int,_2UL> local_1c0 [2];
  ostringstream local_1a0 [8];
  ostringstream msgStr;
  int line_local;
  char *file_local;
  char *msg_local;
  deUint32 err_local;
  
  if (err == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  if (msg != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)local_1a0,msg);
    std::operator<<(poVar1,": ");
  }
  poVar1 = std::operator<<((ostream *)local_1a0,"glGetError() returned ");
  EVar3 = getErrorStr(err);
  local_1c0[0].m_getName = EVar3.m_getName;
  local_1c0[0].m_value = EVar3.m_value;
  tcu::Format::operator<<(poVar1,local_1c0);
  if (err == 0x505) {
    this = (OutOfMemoryError *)__cxa_allocate_exception(0x38);
    std::__cxx11::ostringstream::str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    OutOfMemoryError::OutOfMemoryError(this,pcVar2,(char *)0x0,file,line);
    __cxa_throw(this,&OutOfMemoryError::typeinfo,OutOfMemoryError::~OutOfMemoryError);
  }
  this_00 = (Error *)__cxa_allocate_exception(0x38);
  std::__cxx11::ostringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  Error::Error(this_00,err,pcVar2,(char *)0x0,file,line);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void checkError (deUint32 err, const char* msg, const char* file, int line)
{
	if (err != GL_NO_ERROR)
	{
		std::ostringstream msgStr;
		if (msg)
			msgStr << msg << ": ";

		msgStr << "glGetError() returned " << getErrorStr(err);

		if (err == GL_OUT_OF_MEMORY)
			throw OutOfMemoryError(msgStr.str().c_str(), DE_NULL, file, line);
		else
			throw Error(err, msgStr.str().c_str(), DE_NULL, file, line);
	}
}